

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O2

void Omega_h::add_accept_production(Grammar *g)

{
  Production p;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  pointer local_28;
  pointer piStack_20;
  pointer local_18;
  
  local_50._M_dataplus._M_p._0_4_ = find_goal_symbol(g);
  local_28 = (pointer)0x0;
  piStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  local_30._0_4_ = g->nsymbols;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_28,&local_50);
  std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
  push_back(&g->productions,(value_type *)local_30);
  std::__cxx11::string::string((string *)&local_50,"ACCEPT",&local_51);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&g->symbol_names,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  g->nsymbols = g->nsymbols + 1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_28);
  return;
}

Assistant:

void add_accept_production(Grammar& g) {
  auto goal_symbol = find_goal_symbol(g);
  Grammar::Production p;
  p.lhs = g.nsymbols;
  p.rhs = {goal_symbol};
  g.productions.push_back(p);
  g.symbol_names.push_back("ACCEPT");
  g.nsymbols++;
}